

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_debug_helpers_generated.c
# Opt level: O1

char * mbedtls_ssl_named_group_to_str(uint16_t in)

{
  undefined4 uVar1;
  char *pcVar2;
  undefined6 in_register_0000003a;
  
  uVar1 = (undefined4)CONCAT62(in_register_0000003a,in);
  switch(uVar1) {
  case 0x12:
    pcVar2 = "secp192k1";
    break;
  case 0x13:
    pcVar2 = "secp192r1";
    break;
  case 0x14:
    pcVar2 = "secp224k1";
    break;
  case 0x15:
    pcVar2 = "secp224r1";
    break;
  case 0x16:
    pcVar2 = "secp256k1";
    break;
  case 0x17:
    pcVar2 = "secp256r1";
    break;
  case 0x18:
    pcVar2 = "secp384r1";
    break;
  case 0x19:
    pcVar2 = "secp521r1";
    break;
  case 0x1a:
    pcVar2 = "bp256r1";
    break;
  case 0x1b:
    pcVar2 = "bp384r1";
    break;
  case 0x1c:
    pcVar2 = "bp512r1";
    break;
  case 0x1d:
    pcVar2 = "x25519";
    break;
  case 0x1e:
    pcVar2 = "x448";
    break;
  default:
    switch(uVar1) {
    case 0x100:
      pcVar2 = "ffdhe2048";
      break;
    case 0x101:
      pcVar2 = "ffdhe3072";
      break;
    case 0x102:
      pcVar2 = "ffdhe4096";
      break;
    case 0x103:
      pcVar2 = "ffdhe6144";
      break;
    case 0x104:
      pcVar2 = "ffdhe8192";
      break;
    default:
      pcVar2 = "UNKOWN";
    }
  }
  return pcVar2;
}

Assistant:

const char *mbedtls_ssl_named_group_to_str( uint16_t in )
{
    switch( in )
    {
    case MBEDTLS_SSL_IANA_TLS_GROUP_SECP192K1:
        return "secp192k1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_SECP192R1:
        return "secp192r1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_SECP224K1:
        return "secp224k1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_SECP224R1:
        return "secp224r1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_SECP256K1:
        return "secp256k1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_SECP256R1:
        return "secp256r1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_SECP384R1:
        return "secp384r1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_SECP521R1:
        return "secp521r1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_BP256R1:
        return "bp256r1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_BP384R1:
        return "bp384r1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_BP512R1:
        return "bp512r1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_X25519:
        return "x25519";
    case MBEDTLS_SSL_IANA_TLS_GROUP_X448:
        return "x448";
    case MBEDTLS_SSL_IANA_TLS_GROUP_FFDHE2048:
        return "ffdhe2048";
    case MBEDTLS_SSL_IANA_TLS_GROUP_FFDHE3072:
        return "ffdhe3072";
    case MBEDTLS_SSL_IANA_TLS_GROUP_FFDHE4096:
        return "ffdhe4096";
    case MBEDTLS_SSL_IANA_TLS_GROUP_FFDHE6144:
        return "ffdhe6144";
    case MBEDTLS_SSL_IANA_TLS_GROUP_FFDHE8192:
        return "ffdhe8192";
    };

    return "UNKOWN";
}